

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecHsh.h
# Opt level: O1

int Hsh_IntManAdd(Hsh_IntMan_t *p,int iData)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  Vec_Wrd_t *pVVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  uint *puVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int *piVar10;
  word *pwVar11;
  int iVar12;
  ulong uVar13;
  uint uVar14;
  undefined4 in_register_00000034;
  ulong uVar16;
  long lVar17;
  uint *puVar18;
  uchar *pDataC;
  ulong uVar15;
  
  pVVar2 = p->vTable;
  if (pVVar2->nSize < p->vObjs->nSize) {
    uVar16 = (ulong)(pVVar2->nSize * 2 - 1);
    while( true ) {
      do {
        uVar8 = (uint)uVar16;
        uVar14 = uVar8 + 1;
        uVar15 = (ulong)uVar14;
        uVar13 = uVar16 & 1;
        uVar16 = uVar15;
      } while (uVar13 != 0);
      if (uVar14 < 9) break;
      iVar12 = 5;
      while (uVar14 % (iVar12 - 2U) != 0) {
        uVar7 = iVar12 * iVar12;
        iVar12 = iVar12 + 2;
        if (uVar14 < uVar7) goto LAB_004ed96e;
      }
    }
LAB_004ed96e:
    if (pVVar2->nCap < (int)uVar14) {
      if (pVVar2->pArray == (int *)0x0) {
        piVar10 = (int *)malloc((long)(int)uVar14 << 2);
      }
      else {
        piVar10 = (int *)realloc(pVVar2->pArray,(long)(int)uVar14 << 2);
      }
      pVVar2->pArray = piVar10;
      if (piVar10 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      pVVar2->nCap = uVar14;
    }
    if (uVar8 < 0x7fffffff) {
      memset(pVVar2->pArray,0xff,uVar15 << 2);
    }
    pVVar2->nSize = uVar14;
    pVVar3 = p->vObjs;
    if (0 < pVVar3->nSize) {
      pVVar2 = p->vData;
      pVVar4 = p->vTable;
      lVar17 = 0;
      do {
        iVar12 = p->nSize;
        uVar8 = iVar12 * (int)lVar17;
        if (((int)uVar8 < 0) || (pVVar2->nSize <= (int)uVar8)) goto LAB_004edced;
        if (iVar12 < 1) {
          uVar14 = 0;
        }
        else {
          uVar7 = iVar12 * 4;
          if (iVar12 * 4 < 2) {
            uVar7 = 1;
          }
          uVar16 = 0;
          uVar14 = 0;
          do {
            uVar14 = uVar14 + (uint)*(byte *)((long)pVVar2->pArray + uVar16 + (ulong)uVar8 * 4) *
                              (&Hsh_IntManHash_s_Primes)[uVar16 % 7];
            uVar16 = uVar16 + 1;
          } while (uVar7 != uVar16);
        }
        uVar8 = pVVar4->nSize;
        uVar16 = (ulong)uVar14 % (ulong)uVar8;
        if (((int)uVar16 < 0) || ((int)uVar8 <= (int)uVar16)) goto LAB_004edced;
        piVar10 = pVVar4->pArray;
        *(int *)((long)pVVar3->pArray + lVar17 * 8 + 4) = piVar10[uVar16];
        piVar10[uVar16] = (int)lVar17;
        lVar17 = lVar17 + 1;
      } while (lVar17 < pVVar3->nSize);
    }
  }
  iVar12 = p->nSize;
  uVar8 = iVar12 * iData;
  if (-1 < (int)uVar8) {
    iVar1 = p->vData->nSize;
    if ((int)uVar8 < iVar1) {
      piVar5 = p->vData->pArray;
      piVar10 = piVar5 + uVar8;
      uVar8 = p->vTable->nSize;
      if (iVar12 < 1) {
        uVar14 = 0;
      }
      else {
        uVar16 = 1;
        if (1 < iVar12 * 4) {
          uVar16 = (ulong)(uint)(iVar12 * 4);
        }
        uVar13 = 0;
        uVar14 = 0;
        do {
          uVar14 = uVar14 + (uint)*(byte *)((long)piVar10 + uVar13) *
                            (&Hsh_IntManHash_s_Primes)[uVar13 % 7];
          uVar13 = uVar13 + 1;
        } while (uVar16 != uVar13);
      }
      uVar16 = (ulong)uVar14 % (ulong)uVar8;
      iVar9 = (int)uVar16;
      if ((-1 < iVar9) && (iVar9 < (int)uVar8)) {
        puVar6 = (uint *)(p->vTable->pArray + uVar16);
        do {
          puVar18 = puVar6;
          uVar8 = *puVar18;
          uVar16 = (ulong)uVar8;
          if (uVar16 == 0xffffffff) {
            pwVar11 = (word *)0x0;
          }
          else {
            if (((int)uVar8 < 0) || (p->vObjs->nSize <= (int)uVar8)) goto LAB_004edd0c;
            pwVar11 = p->vObjs->pArray + uVar16;
          }
          if (pwVar11 == (word *)0x0) {
            if (uVar8 != 0xffffffff) {
              __assert_fail("*pPlace == -1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecHsh.h"
                            ,0x9a,"int *Hsh_IntManLookup(Hsh_IntMan_t *, unsigned int *)");
            }
            goto LAB_004edc29;
          }
          uVar14 = (int)*pwVar11 * iVar12;
          if (((int)uVar14 < 0) || (iVar1 <= (int)uVar14)) goto LAB_004edced;
          iVar9 = bcmp(piVar10,piVar5 + uVar14,(long)iVar12 * 4);
          puVar6 = (uint *)((long)pwVar11 + 4);
        } while (iVar9 != 0);
        if (uVar8 != 0xffffffff) {
          if ((-1 < (int)uVar8) && ((int)uVar8 < p->vObjs->nSize)) {
            return (int)((long)p->vObjs->pArray + (uVar16 * 8 - (long)p->vObjs->pArray) >> 3);
          }
LAB_004edd0c:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWrd.h"
                        ,0x19d,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
        }
LAB_004edc29:
        pVVar3 = p->vObjs;
        *puVar18 = pVVar3->nSize;
        uVar8 = pVVar3->nCap;
        if (pVVar3->nSize == uVar8) {
          if ((int)uVar8 < 0x10) {
            if (pVVar3->pArray == (word *)0x0) {
              pwVar11 = (word *)malloc(0x80);
            }
            else {
              pwVar11 = (word *)realloc(pVVar3->pArray,0x80);
            }
            pVVar3->pArray = pwVar11;
            iVar12 = 0x10;
          }
          else {
            iVar12 = uVar8 * 2;
            if (iVar12 <= (int)uVar8) goto LAB_004edcad;
            if (pVVar3->pArray == (word *)0x0) {
              pwVar11 = (word *)malloc((ulong)uVar8 << 4);
            }
            else {
              pwVar11 = (word *)realloc(pVVar3->pArray,(ulong)uVar8 << 4);
            }
            pVVar3->pArray = pwVar11;
          }
          if (pwVar11 == (word *)0x0) {
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWrd.h"
                          ,0x1e4,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
          }
          pVVar3->nCap = iVar12;
        }
LAB_004edcad:
        iVar12 = pVVar3->nSize;
        pVVar3->nSize = iVar12 + 1;
        pVVar3->pArray[iVar12] = CONCAT44(in_register_00000034,iData) | 0xffffffff00000000;
        return p->vObjs->nSize + -1;
      }
    }
  }
LAB_004edced:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                ,0x1af,"int *Vec_IntEntryP(Vec_Int_t *, int)");
}

Assistant:

static inline int Hsh_IntManAdd( Hsh_IntMan_t * p, int iData )
{
    int i, * pPlace;
    if ( Vec_WrdSize(p->vObjs) > Vec_IntSize(p->vTable) )
    {
        Vec_IntFill( p->vTable, Abc_PrimeCudd(2*Vec_IntSize(p->vTable)), -1 );
        for ( i = 0; i < Vec_WrdSize(p->vObjs); i++ )
        {
            pPlace = Vec_IntEntryP( p->vTable, Hsh_IntManHash(Hsh_IntData(p, i), p->nSize, Vec_IntSize(p->vTable)) );
            Hsh_IntObj(p, i)->iNext = *pPlace;  *pPlace = i;
        }
    }
    pPlace = Hsh_IntManLookup( p, Hsh_IntData(p, iData) );
    if ( *pPlace == -1 )
    {
        *pPlace = Vec_WrdSize(p->vObjs);
        Vec_WrdPush( p->vObjs, Hsh_IntWord(iData, -1) );
        return Vec_WrdSize(p->vObjs) - 1;
    }
    return (word *)Hsh_IntObj(p, *pPlace) - Vec_WrdArray(p->vObjs);
}